

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
ptc::Print<char>::print_backend<std::ostream&,char_const(&)[13],char_const(&)[12]>
          (Print<char> *this,basic_ostream<char,_std::char_traits<char>_> *os,char (*first) [13],
          char (*args) [12])

{
  size_type sVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  ANSI local_30 [2];
  
  std::mutex::lock((mutex *)mutex_);
  local_30[0] = first;
  bVar2 = is_escape<char[13]>(first,local_30);
  if ((bVar2) || ((this->pattern)._M_string_length == 0)) {
    std::operator<<((ostream *)os,*first);
  }
  else {
    poVar3 = std::operator<<((ostream *)os,(string *)&this->pattern);
    poVar3 = std::operator<<(poVar3,*first);
    std::operator<<(poVar3,(string *)&this->pattern);
  }
  local_30[0] = first;
  bVar2 = is_escape<char[13]>(first,local_30);
  psVar4 = (string *)&this->pattern;
  sVar1 = (this->pattern)._M_string_length;
  if (bVar2) {
    if (sVar1 == 0) {
      poVar3 = std::operator<<((ostream *)os,*args);
    }
    else {
      poVar3 = std::operator<<((ostream *)os,psVar4);
      poVar3 = std::operator<<(poVar3,*args);
      poVar3 = std::operator<<(poVar3,psVar4);
    }
    psVar4 = (string *)&this->sep;
LAB_0010c528:
    std::operator<<(poVar3,psVar4);
  }
  else {
    if (sVar1 != 0) {
      poVar3 = std::operator<<((ostream *)os,(string *)&this->sep);
      poVar3 = std::operator<<(poVar3,psVar4);
      poVar3 = std::operator<<(poVar3,*args);
      goto LAB_0010c528;
    }
    poVar3 = std::operator<<((ostream *)os,(string *)&this->sep);
    std::operator<<(poVar3,*args);
  }
  std::operator<<((ostream *)os,(string *)this);
  local_30[0] = generic;
  bVar2 = is_escape<char[13]>(first,local_30);
  if (!bVar2) {
    local_30[1] = 1;
    bVar2 = is_escape<char[12]>(args,local_30 + 1);
    if (!bVar2) goto LAB_0010c57b;
  }
  std::operator<<((ostream *)os,"\x1b[0m");
LAB_0010c57b:
  if (this->flush == true) {
    std::ostream::flush();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }